

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Schema * sqlite3SchemaGet(sqlite3 *db,Btree *pBt)

{
  Schema *local_20;
  Schema *p;
  Btree *pBt_local;
  sqlite3 *db_local;
  
  if (pBt == (Btree *)0x0) {
    local_20 = (Schema *)sqlite3DbMallocZero((sqlite3 *)0x0,0x78);
  }
  else {
    local_20 = (Schema *)sqlite3BtreeSchema(pBt,0x78,sqlite3SchemaClear);
  }
  if (local_20 == (Schema *)0x0) {
    sqlite3OomFault(db);
  }
  else if (local_20->file_format == '\0') {
    sqlite3HashInit(&local_20->tblHash);
    sqlite3HashInit(&local_20->idxHash);
    sqlite3HashInit(&local_20->trigHash);
    sqlite3HashInit(&local_20->fkeyHash);
    local_20->enc = '\x01';
  }
  return local_20;
}

Assistant:

SQLITE_PRIVATE Schema *sqlite3SchemaGet(sqlite3 *db, Btree *pBt){
  Schema * p;
  if( pBt ){
    p = (Schema *)sqlite3BtreeSchema(pBt, sizeof(Schema), sqlite3SchemaClear);
  }else{
    p = (Schema *)sqlite3DbMallocZero(0, sizeof(Schema));
  }
  if( !p ){
    sqlite3OomFault(db);
  }else if ( 0==p->file_format ){
    sqlite3HashInit(&p->tblHash);
    sqlite3HashInit(&p->idxHash);
    sqlite3HashInit(&p->trigHash);
    sqlite3HashInit(&p->fkeyHash);
    p->enc = SQLITE_UTF8;
  }
  return p;
}